

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O2

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::CheckVars(SolutionChecker<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            *this,SolCheck *chk)

{
  _Manager_type *this_00;
  double __x;
  double dVar1;
  double dVar2;
  _Manager_type p_Var3;
  _Invoker_type epsabs;
  Violation viol;
  long lVar4;
  reference pvVar5;
  char *pcVar6;
  long lVar7;
  ulong __n;
  int i;
  Violation viol_00;
  Violation viol_01;
  
  this_00 = &this[-0x13].recomp_fn.super__Function_base._M_manager;
  for (lVar7 = (long)(int)((ulong)((long)this[-0x11].recomp_fn._M_invoker -
                                  (long)this[-0x11].recomp_fn.super__Function_base._M_manager) >> 3)
      ; lVar7 != 0; lVar7 = lVar7 + -1) {
    __x = (chk->x_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7 + -1];
    lVar4 = (long)*(int *)((long)&this[-7].recomp_fn.super__Function_base._M_functor + 8);
    if ((lVar7 <= lVar4) || (chk->fRecomputedVals_ == false)) {
      __n = (ulong)(lVar4 < lVar7);
      pvVar5 = std::array<mp::ViolSummary,_2UL>::at(&chk->viol_var_bnds_,__n);
      dVar1 = *(double *)(this[-0x11].recomp_fn.super__Function_base._M_manager + lVar7 * 8 + -8);
      dVar2 = *(double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8);
      p_Var3 = this[7].recomp_fn.super__Function_base._M_manager;
      i = (int)lVar7 + -1;
      pcVar6 = FlatModel<mp::DefaultFlatModelParams>::var_name
                         ((FlatModel<mp::DefaultFlatModelParams> *)this_00,i);
      viol_00.valX_ = dVar1;
      viol_00.viol_ = dVar1 - __x;
      ViolSummary::CheckViol(pvVar5,viol_00,dVar2,(double)p_Var3,pcVar6);
      pvVar5 = std::array<mp::ViolSummary,_2UL>::at(&chk->viol_var_bnds_,__n);
      dVar1 = *(double *)
               (*(long *)((long)&this[-0x10].recomp_fn.super__Function_base._M_functor + 8) + -8 +
               lVar7 * 8);
      dVar2 = *(double *)((long)&this[7].recomp_fn.super__Function_base._M_functor + 8);
      p_Var3 = this[7].recomp_fn.super__Function_base._M_manager;
      pcVar6 = FlatModel<mp::DefaultFlatModelParams>::var_name
                         ((FlatModel<mp::DefaultFlatModelParams> *)this_00,i);
      viol.valX_ = dVar1;
      viol.viol_ = __x - dVar1;
      ViolSummary::CheckViol(pvVar5,viol,dVar2,(double)p_Var3,pcVar6);
      if (*(int *)(this[-0xe].recomp_fn.super__Function_base._M_manager + lVar7 * 4 + -4) == 1) {
        pvVar5 = std::array<mp::ViolSummary,_2UL>::at(&chk->viol_var_int_,__n);
        dVar1 = round(__x);
        epsabs = this[7].recomp_fn._M_invoker;
        pcVar6 = FlatModel<mp::DefaultFlatModelParams>::var_name
                           ((FlatModel<mp::DefaultFlatModelParams> *)this_00,i);
        viol_01.valX_ = dVar1;
        viol_01.viol_ = ABS(__x - dVar1);
        ViolSummary::CheckViol(pvVar5,viol_01,(double)epsabs,INFINITY,pcVar6);
      }
    }
  }
  return;
}

Assistant:

void CheckVars(SolCheck& chk) {
    for (auto i=MPCD( num_vars() ); i--; ) {
      auto x = chk.x(i);
      bool aux = !MPCD( is_var_original(i) );
      // no aux vars for idealistic mode
      if (!aux || !chk.if_recomputed()) {
        chk.VarViolBnds().at(aux).CheckViol(
              {MPCD( lb(i) ) - x, MPCD( lb(i) )},
              MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
              MPCD( GetModel() ).var_name(i));
        chk.VarViolBnds().at(aux).CheckViol(
              {x - MPCD( ub(i) ), MPCD( ub(i) )},
              MPCD( sol_feas_tol() ), MPCD( sol_feas_tol_rel() ),
              MPCD( GetModel() ).var_name(i));
        if (MPCD( is_var_integer(i) ))
          chk.VarViolIntty().at(aux).CheckViol(
                { std::fabs(x - std::round(x)),
                  std::round(x) },
                MPCD( sol_int_tol() ), INFINITY,
                MPCD( GetModel() ).var_name(i));
      }
    }
  }